

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_iq4_nl,_4L,_4L,_(ggml_type)8>::forward_mul_mat_id
          (tensor_traits<block_iq4_nl,_4L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  int64_t iVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  int64_t iVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ggml_from_float_t p_Var19;
  int64_t iVar20;
  void *pvVar21;
  bool bVar22;
  long lVar23;
  long lVar24;
  ggml_type_traits_cpu *pgVar25;
  size_t sVar26;
  size_t sVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  char *pcVar33;
  long lVar34;
  long lVar35;
  size_t __n;
  ulong uVar36;
  undefined8 uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  void *pvVar43;
  void *pvVar44;
  uint uVar45;
  
  pgVar3 = op->src[0];
  pgVar4 = op->src[1];
  pgVar5 = op->src[2];
  iVar6 = pgVar3->ne[0];
  lVar7 = pgVar3->ne[1];
  lVar35 = pgVar3->ne[2];
  lVar28 = pgVar3->ne[3];
  sVar27 = pgVar3->nb[0];
  sVar8 = pgVar3->nb[1];
  sVar9 = pgVar3->nb[2];
  iVar10 = pgVar4->ne[0];
  lVar11 = pgVar4->ne[1];
  lVar12 = pgVar4->ne[2];
  lVar34 = pgVar4->ne[3];
  sVar13 = pgVar4->nb[0];
  sVar14 = pgVar4->nb[1];
  sVar15 = pgVar4->nb[2];
  lVar40 = op->ne[3];
  sVar16 = op->nb[0];
  uVar17 = op->nb[1];
  uVar18 = op->nb[2];
  uVar36 = op->nb[3];
  iVar1 = params->ith;
  lVar23 = (long)iVar1;
  lVar24 = (long)params->nth;
  pgVar25 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
  p_Var19 = pgVar25->from_float;
  sVar26 = ggml_type_size(pgVar3->type);
  if (sVar27 == sVar26) {
    sVar27 = ggml_type_size(pgVar4->type);
    if (sVar13 == sVar27) {
      if (sVar16 == 4) {
        if (uVar17 < 4) {
          pcVar33 = "nb0 <= nb1";
          uVar37 = 0x1813;
        }
        else if (uVar18 < uVar17) {
          pcVar33 = "nb1 <= nb2";
          uVar37 = 0x1814;
        }
        else if (uVar36 < uVar18) {
          pcVar33 = "nb2 <= nb3";
          uVar37 = 0x1815;
        }
        else if (lVar28 == 1) {
          if (lVar34 == 1) {
            if (lVar40 == 1) {
              if (pgVar4->type == GGML_TYPE_F32) {
                iVar20 = pgVar5->ne[0];
                lVar28 = ggml_row_size(8,iVar10);
                lVar34 = lVar28 * lVar11;
                uVar36 = lVar34 * lVar12 + 7U & 0xfffffffffffffff8;
                __n = (lVar35 << 0x20) >> 0x1d;
                if (__n * lVar12 + __n + uVar36 <= params->wsize) {
                  pvVar21 = params->wdata;
                  if (0 < lVar12) {
                    pvVar43 = (void *)(lVar28 * lVar23 + (long)pvVar21);
                    lVar39 = sVar14 * lVar23;
                    lVar29 = 0;
                    lVar40 = lVar23;
                    pvVar44 = pvVar43;
                    lVar32 = lVar39;
                    do {
                      for (; lVar40 < lVar11; lVar40 = lVar40 + lVar24) {
                        (*p_Var19)((float *)((long)pgVar4->data + lVar39),pvVar43,iVar10);
                        pvVar43 = (void *)((long)pvVar43 + lVar28 * lVar24);
                        lVar39 = lVar39 + sVar14 * lVar24;
                      }
                      lVar29 = lVar29 + 1;
                      pvVar43 = (void *)((long)pvVar44 + lVar34);
                      lVar39 = lVar32 + sVar15;
                      lVar40 = lVar23;
                      pvVar44 = pvVar43;
                      lVar32 = lVar39;
                    } while (lVar29 != lVar12);
                  }
                  pvVar43 = (void *)((long)pvVar21 + uVar36);
                  uVar45 = (uint)lVar35;
                  if ((iVar1 == 0) && (memset(pvVar43,0,__n), 0 < pgVar5->ne[1])) {
                    uVar41 = (uint)iVar20;
                    lVar35 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        pvVar44 = pgVar5->data;
                        uVar38 = 0;
                        do {
                          iVar2 = *(int *)((long)pvVar44 +
                                          pgVar5->nb[0] * uVar38 + pgVar5->nb[1] * lVar35);
                          lVar40 = (long)iVar2;
                          if ((lVar40 < 0) || ((int)uVar45 <= iVar2)) {
                            pcVar33 = "i02 >= 0 && i02 < n_as";
                            uVar37 = 0x1848;
                            goto LAB_0011edaa;
                          }
                          lVar39 = *(long *)((long)pvVar43 + lVar40 * 8);
                          lVar32 = lVar12 * lVar40 * 8 + __n;
                          *(int *)((long)pvVar43 + lVar39 * 8 + lVar32) = (int)uVar38;
                          *(int *)((long)pvVar43 + lVar39 * 8 + lVar32 + 4) = (int)lVar35;
                          *(long *)((long)pvVar43 + lVar40 * 8) = lVar39 + 1;
                          uVar38 = uVar38 + 1;
                        } while ((uVar41 & 0x7fffffff) != uVar38);
                      }
                      lVar35 = lVar35 + 1;
                    } while (lVar35 < pgVar5->ne[1]);
                  }
                  ggml_barrier(params->threadpool);
                  if (0 < (int)uVar45) {
                    lVar35 = (long)pvVar21 + uVar36 + __n + 4;
                    uVar36 = 0;
                    do {
                      lVar40 = *(long *)((long)pvVar43 + uVar36 * 8);
                      if (lVar40 == 0) {
                        bVar22 = false;
                      }
                      else {
                        uVar30 = (lVar23 * lVar7) / lVar24;
                        uVar31 = ((iVar1 + 1) * lVar7) / lVar24;
                        uVar38 = uVar30 + 3;
                        if (-1 < (long)uVar30) {
                          uVar38 = uVar30;
                        }
                        uVar42 = (uVar38 & 0xfffffffffffffffc) + 4;
                        if (uVar30 == (uVar38 & 0xfffffffffffffffc)) {
                          uVar42 = uVar30;
                        }
                        uVar38 = uVar31 + 3;
                        if (-1 < (long)uVar31) {
                          uVar38 = uVar31;
                        }
                        uVar30 = (uVar38 & 0xfffffffffffffffc) + 4;
                        if (uVar31 == (uVar38 & 0xfffffffffffffffc)) {
                          uVar30 = uVar31;
                        }
                        bVar22 = true;
                        if (((long)uVar42 < (long)uVar30) && (bVar22 = false, 0 < lVar40)) {
                          pvVar44 = pgVar3->data;
                          lVar39 = 0;
                          uVar38 = uVar36;
                          do {
                            lVar32 = (long)*(int *)(lVar35 + -4 + lVar39 * 8);
                            lVar29 = (long)*(int *)(lVar35 + lVar39 * 8);
                            sVar27 = (lVar32 % lVar11) * lVar28;
                            gemv<block_iq4_nl,4l,4l,(ggml_type)8>
                                      ((int)iVar6,
                                       (float *)((long)op->data +
                                                uVar42 * 4 + lVar29 * uVar18 + lVar32 * uVar17),
                                       sVar27,(void *)((long)pvVar44 +
                                                      uVar42 * sVar8 + sVar9 * uVar36),
                                       (void *)((long)pvVar21 + sVar27 + lVar34 * lVar29),
                                       (int)uVar38,(int)uVar30 - (int)uVar42);
                            lVar39 = lVar39 + 1;
                          } while (lVar40 != lVar39);
                          bVar22 = false;
                        }
                      }
                      if (bVar22) {
                        return;
                      }
                      uVar36 = uVar36 + 1;
                      lVar35 = lVar35 + lVar12 * 8;
                    } while (uVar36 != (uVar45 & 0x7fffffff));
                  }
                  return;
                }
                pcVar33 = 
                "params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) + n_as * ne12 * sizeof(mmid_row_mapping))"
                ;
                uVar37 = 0x182b;
              }
              else {
                pcVar33 = "src1->type == GGML_TYPE_F32";
                uVar37 = 0x181b;
              }
            }
            else {
              pcVar33 = "ne3 == 1";
              uVar37 = 0x1819;
            }
          }
          else {
            pcVar33 = "ne13 == 1";
            uVar37 = 0x1818;
          }
        }
        else {
          pcVar33 = "ne03 == 1";
          uVar37 = 0x1817;
        }
      }
      else {
        pcVar33 = "nb0 == sizeof(float)";
        uVar37 = 0x1812;
      }
    }
    else {
      pcVar33 = "nb10 == ggml_type_size(src1->type)";
      uVar37 = 0x180f;
    }
  }
  else {
    pcVar33 = "nb00 == ggml_type_size(src0->type)";
    uVar37 = 0x180e;
  }
LAB_0011edaa:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar33);
}

Assistant:

void forward_mul_mat_id(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        const ggml_tensor * ids  = op->src[2];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        // we don't support permuted src0 or src1
        GGML_ASSERT(nb00 == ggml_type_size(src0->type));
        GGML_ASSERT(nb10 == ggml_type_size(src1->type));

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(ne03 == 1);
        GGML_ASSERT(ne13 == 1);
        GGML_ASSERT(ne3  == 1);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        // row groups
        const int n_ids = ids->ne[0]; // n_expert_used
        const int n_as  = ne02;       // n_expert

        const size_t nbw1 = ggml_row_size(PARAM_TYPE, ne10);
        const size_t nbw2 = nbw1*ne11;
        const size_t nbw3 = nbw2*ne12;

        struct mmid_row_mapping {
            int32_t i1;
            int32_t i2;
        };

        GGML_ASSERT(params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) +
                                      n_as * ne12 * sizeof(mmid_row_mapping)));

        auto * wdata             = (char *)     params->wdata;
        auto * wdata_src1_end    = (char *)     wdata + GGML_PAD(nbw3, sizeof(int64_t));
        auto * matrix_row_counts = (int64_t *) (wdata_src1_end); // [n_as]

        struct mmid_row_mapping * matrix_rows = (struct mmid_row_mapping *) (matrix_row_counts + n_as);  // [n_as][ne12]

        // src1: float32 => param type
        for (int64_t i12 = 0; i12 < ne12; ++i12) {
            for (int64_t i11 = ith; i11 < ne11; i11 += nth) {
                from_float((float *)((char *) src1->data + i12 * nb12 + i11 * nb11),
                           (void *)               (wdata + i12 * nbw2 + i11 * nbw1),
                           ne10);
            }
        }

#define MMID_MATRIX_ROW(row_id, i1) matrix_rows[(row_id) * ne12 + (i1)]

        if (ith == 0) {
            // initialize matrix_row_counts
            memset(matrix_row_counts, 0, n_as * sizeof(int64_t));

            // group rows by src0 matrix
            for (int32_t iid1 = 0; iid1 < ids->ne[1]; ++iid1) {
                for (int32_t id = 0; id < n_ids; ++id) {
                    const int32_t i02 =
                        *(const int32_t *) ((const char *) ids->data + iid1 * ids->nb[1] + id * ids->nb[0]);

                    GGML_ASSERT(i02 >= 0 && i02 < n_as);

                    MMID_MATRIX_ROW(i02, matrix_row_counts[i02]) = { id, iid1 };
                    matrix_row_counts[i02] += 1;
                }
            }
        }

        ggml_barrier(params->threadpool);

        // compute each matrix multiplication in sequence
        for (int cur_a = 0; cur_a < n_as; ++cur_a) {
            const int64_t cne1 = matrix_row_counts[cur_a];

            if (cne1 == 0) {
                continue;
            }

            const auto * src0_cur = (const char *) src0->data + cur_a*nb02;

            //const int64_t nr0 = ne01; // src0 rows
            const int64_t nr1 = cne1; // src1 rows

            int64_t src0_cur_start = (ith * ne01) / nth;
            int64_t src0_cur_end   = ((ith + 1) * ne01) / nth;

            src0_cur_start = (src0_cur_start % NB_COLS) ? src0_cur_start + NB_COLS - (src0_cur_start % NB_COLS) : src0_cur_start;
            src0_cur_end   = (src0_cur_end   % NB_COLS) ? src0_cur_end   + NB_COLS - (src0_cur_end   % NB_COLS) : src0_cur_end;

            if (src0_cur_start >= src0_cur_end) {
                return;
            }

            for (int ir1 = 0; ir1 < nr1; ir1++) {
                struct mmid_row_mapping row_mapping = MMID_MATRIX_ROW(cur_a, ir1);

                const int id = row_mapping.i1; // selected expert index

                const int64_t i11 = id % ne11;
                const int64_t i12 = row_mapping.i2; // row index in src1

                const int64_t i1 = id;  // selected expert index
                const int64_t i2 = i12; // row

                const auto * src1_col = (const char *) wdata + (i11 * nbw1 + i12 * nbw2);

                gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                        (float *)((char *) dst->data + (i1 * nb1 + i2 * nb2)) + src0_cur_start, ne01,
                        src0_cur + src0_cur_start * nb01,
                        src1_col, 1, src0_cur_end - src0_cur_start);
            }
        }
#undef MMID_MATRIX_ROW
    }